

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcStyledItem::IfcStyledItem(IfcStyledItem *this)

{
  IfcStyledItem *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcStyledItem");
  IfcRepresentationItem::IfcRepresentationItem
            ((IfcRepresentationItem *)this,&PTR_construction_vtable_24__00f9aaa8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>,
             &PTR_construction_vtable_24__00f9aac8);
  *(undefined8 *)this = 0xf9aa40;
  *(undefined8 *)&this->field_0x70 = 0xf9aa90;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)0xf9aa68;
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x10);
  STEP::
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_1UL,_0UL>::
  ListOf((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_1UL,_0UL>
          *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x20);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Name);
  return;
}

Assistant:

IfcStyledItem() : Object("IfcStyledItem") {}